

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O1

Result __thiscall tcu::ThreadUtil::Event::waitReady(Event *this)

{
  deMutex_lock((this->m_lock).m_mutex);
  if (this->m_result == RESULT_NOT_READY) {
    this->m_waiterCount = this->m_waiterCount + 1;
    deMutex_unlock((this->m_lock).m_mutex);
    deSemaphore_decrement((this->m_waiters).m_semaphore);
  }
  else {
    deMutex_unlock((this->m_lock).m_mutex);
  }
  return this->m_result;
}

Assistant:

Event::Result Event::waitReady (void)
{
	m_lock.lock();

	if (m_result == RESULT_NOT_READY)
		m_waiterCount++;
	else
	{
		m_lock.unlock();
		return m_result;
	}

	m_lock.unlock();

	m_waiters.decrement();

	return m_result;
}